

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool GlobOpt::DoLossyIntTypeSpec(Func *func)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeProfileInfo *this;
  
  sourceContextId = Func::GetSourceContextId(func);
  functionId = Func::GetLocalFunctionId(func);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,LossyIntTypeSpecPhase,sourceContextId,functionId);
  if ((!bVar1) && (bVar1 = IsTypeSpecPhaseOff(func), !bVar1)) {
    bVar1 = Func::HasProfileInfo(func);
    if (!bVar1) {
      return true;
    }
    this = Func::GetReadOnlyProfileInfo(func);
    bVar1 = JITTimeProfileInfo::IsLossyIntTypeSpecDisabled(this);
    return !bVar1;
  }
  return false;
}

Assistant:

bool
GlobOpt::DoLossyIntTypeSpec(Func const * func)
{
    return
        !PHASE_OFF(Js::LossyIntTypeSpecPhase, func) &&
        !IsTypeSpecPhaseOff(func) &&
        (!func->HasProfileInfo() || !func->GetReadOnlyProfileInfo()->IsLossyIntTypeSpecDisabled());
}